

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void __thiscall
Diffusion::diffuse_Ssync
          (Diffusion *this,MultiFab *Ssync,int sigma,int nComp,Real dt,Real be_cn_theta,
          MultiFab *rho_half,int rho_flag,MultiFab **flux,int fluxComp,MultiFab **beta,int betaComp,
          MultiFab *alpha,int alphaComp)

{
  NavierStokesBase *pNVar1;
  pointer pSVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  int iVar6;
  TimeCenter TVar7;
  StateDescriptor *this_00;
  string *psVar8;
  EBFArrayBoxFactory *pEVar9;
  FabArray<amrex::FArrayBox> *rho;
  undefined4 in_register_00000014;
  long lVar10;
  long lVar11;
  Print *this_01;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  Real RVar18;
  double dVar19;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<const_amrex::MultiFab_*> __l_04;
  int flux_allnull;
  int flux_allthere;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  Real rhsscale;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  int allthere;
  pair<double,_double> scalars;
  MLMG mlmg;
  MLEBABecLap mlabec;
  MultiFab Soln;
  MultiFab Rhs;
  allocator_type local_bb3;
  allocator_type local_bb2;
  allocator_type local_bb1;
  long local_bb0;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_ba8;
  allocator_type local_b9c [4];
  Box local_b98;
  Real local_b78;
  long local_b70;
  long local_b68;
  FabArray<amrex::FArrayBox> *local_b60;
  undefined8 local_b58;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_b50;
  ulong local_b48;
  ulong local_b40;
  long local_b38;
  long local_b30;
  EBFArrayBoxFactory *local_b28;
  Array4<double> local_b20;
  Real local_ae0;
  FabArray<amrex::FArrayBox> *local_ad8;
  DistributionMapping local_ad0;
  Real local_ac0;
  Array4<const_double> local_ab8;
  vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  local_a78;
  double local_a60;
  Real local_a58;
  int local_a4c;
  LPInfo local_a48;
  Print local_a28;
  MLMG local_8a0;
  undefined1 local_708 [8];
  Arena *local_700;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_6f8;
  int local_6dc;
  FabArray<amrex::FArrayBox> local_330;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_b58 = CONCAT44(in_register_00000014,sigma);
  iVar6 = sigma + 3;
  local_bb0 = CONCAT44(local_bb0._4_4_,iVar6);
  this_01 = (Print *)this;
  local_b78 = be_cn_theta;
  local_b60 = &Ssync->super_FabArray<amrex::FArrayBox>;
  local_ae0 = dt;
  local_ad8 = &rho_half->super_FabArray<amrex::FArrayBox>;
  if (0 < nComp && verbose != 0) {
    iVar14 = nComp;
    do {
      local_700 = (Arena *)amrex::OutStream();
      local_708._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_708._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_6f8);
      *(undefined8 *)
       ((long)&vStack_6f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_6f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            (local_700->_vptr_Arena[-3] + (long)&(local_700->arena_info).release_threshold);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_6f8,"Diffusion::diffuse_Ssync lev: ",0x1e);
      std::ostream::operator<<((ostringstream *)&vStack_6f8,this->level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_6f8," ",1);
      this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
      psVar8 = amrex::StateDescriptor::name_abi_cxx11_(this_00,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_6f8,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      local_8a0.verbose = CONCAT31(local_8a0.verbose._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_6f8,(char *)&local_8a0,1);
      this_01 = (Print *)local_708;
      amrex::Print::~Print((Print *)local_708);
      iVar6 = iVar6 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  local_a60 = amrex::ParallelDescriptor::second();
  checkBeta((Diffusion *)this_01,beta,&local_a4c);
  local_708 = (undefined1  [8])0x1;
  local_700 = (Arena *)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,this->grids,this->dmap,nComp,0,(MFInfo *)local_708,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_6f8);
  amrex::MultiFab::Copy((MultiFab *)&local_1b0,(MultiFab *)local_b60,(int)local_b58,0,nComp,0);
  if (1 < verbose) {
    local_708 = (undefined1  [8])0x1;
    local_700 = (Arena *)0x0;
    vStack_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_8a0,this->grids,this->dmap,nComp,0,(MFInfo *)local_708,
               (this->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_6f8);
    amrex::MultiFab::Copy((MultiFab *)&local_8a0,(MultiFab *)&local_1b0,0,0,nComp,0);
    if (0 < nComp) {
      local_ba8._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (((this->navier_stokes->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      iVar6 = 0;
      do {
        if (rho_flag == 2) {
          amrex::MultiFab::Divide
                    ((MultiFab *)&local_8a0,
                     (MultiFab *)
                     local_ba8._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,3,iVar6,1,0);
        }
        RVar18 = amrex::MultiFab::norm0((MultiFab *)&local_8a0,iVar6,0,false,false);
        local_700 = (Arena *)amrex::OutStream();
        local_708._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
        local_708._0_4_ = *(int *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_6f8);
        *(undefined8 *)
         ((long)&vStack_6f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_6f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              (local_700->_vptr_Arena[-3] + (long)&(local_700->arena_info).release_threshold);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_6f8,"Original max of Ssync of comp ",0x1e);
        std::ostream::operator<<((ostringstream *)&vStack_6f8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_6f8,": ",2);
        std::ostream::_M_insert<double>(RVar18);
        local_a28.rank._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_6f8,(char *)&local_a28,1);
        amrex::Print::~Print((Print *)local_708);
        iVar6 = iVar6 + 1;
      } while (nComp != iVar6);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)&local_8a0);
  }
  local_ac0 = 1.0;
  local_a58 = visc_tol;
  local_708 = (undefined1  [8])0x1;
  local_700 = (Arena *)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_330,this->grids,this->dmap,nComp,1,(MFInfo *)local_708,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_6f8);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_330,0.0,0,local_330.super_FabArrayBase.n_comp,
             &local_330.super_FabArrayBase.n_grow);
  local_a48.do_semicoarsening = false;
  local_a48.agg_grid_size = -1;
  local_a48.con_grid_size = -1;
  local_a48.has_metric_term = true;
  local_a48.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_a48.max_coarsening_level = 0x1e;
  local_a48.max_semicoarsening_level = 0;
  local_a48.semicoarsening_direction = -1;
  local_a48.hidden_direction = -1;
  local_a48.do_consolidation = (anonymous_namespace)::consolidation != 0;
  pNVar1 = this->navier_stokes;
  pEVar9 = (EBFArrayBoxFactory *)
           __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar9 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  memcpy(&local_8a0,&(pNVar1->super_AmrLevel).geom,200);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_8a0;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_b20,__l,local_b9c);
  amrex::BoxArray::BoxArray((BoxArray *)&local_a28,this->grids);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_a28;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ab8,__l_00,
             &local_bb1);
  local_ad0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->dmap->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_ad0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->dmap->m_ref).
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_ad0.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_ad0.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_ad0.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_ad0.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_ad0.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 1;
  __l_01._M_array = &local_ad0;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98,__l_01,&local_bb2);
  __l_02._M_len = 1;
  __l_02._M_array = &local_b28;
  local_b28 = pEVar9;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector(&local_a78,__l_02,&local_bb3);
  amrex::MLEBABecLap::MLEBABecLap
            ((MLEBABecLap *)local_708,
             (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_b20,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ab8,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98,&local_a48,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&local_a78,nComp);
  if (local_a78.
      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a78.
                    super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a78.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a78.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98);
  if (local_ad0.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ab8);
  amrex::BoxArray::~BoxArray((BoxArray *)&local_a28);
  pvVar3 = (void *)CONCAT71(local_b20.p._1_7_,local_b20.p._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_b20.kstride - (long)pvVar3);
  }
  local_6dc = max_order;
  setDomainBC(this,(array<amrex::LinOpBCType,_3UL> *)&local_a78,
              (array<amrex::LinOpBCType,_3UL> *)&local_ad0,(int)local_bb0);
  amrex::MLLinOp::setDomainBC
            ((MLLinOp *)local_708,(Array<BCType,_3> *)&local_a78,(Array<BCType,_3> *)&local_ad0);
  if (0 < this->level) {
    amrex::MLLinOp::setCoarseFineBC((MLLinOp *)local_708,(MultiFab *)0x0,(this->crse_ratio).vect[0])
    ;
  }
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)local_708,0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0,
             (MultiFab *)0x0);
  local_b78 = local_b78 * local_ae0;
  amrex::MultiFab::MultiFab((MultiFab *)&local_8a0);
  local_a28._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_a28.os = (ostream *)0x0;
  pSVar2 = (this->navier_stokes->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar7 = amrex::StateDescriptor::timeType(pSVar2->desc);
  if (TVar7 == Point) {
    RVar18 = (pSVar2->new_time).stop;
  }
  else {
    RVar18 = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
  }
  rho = &amrex::AmrLevel::get_data(&this->navier_stokes->super_AmrLevel,0,RVar18)->
         super_FabArray<amrex::FArrayBox>;
  if (rho_flag == 1) {
    rho = local_ad8;
  }
  computeAlpha((MultiFab *)&local_8a0,(pair<double,_double> *)&local_a28,1.0,local_b78,&local_ac0,
               alpha,alphaComp,rho_flag,(MultiFab *)rho,(uint)(rho_flag != 1) * 3);
  amrex::MLEBABecLap::setScalars((MLEBABecLap *)local_708,(Real)local_a28._0_8_,(Real)local_a28.os);
  amrex::MLEBABecLap::setACoeffs((MLEBABecLap *)local_708,0,(MultiFab *)&local_8a0);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_8a0);
  setBeta((MLEBABecLap *)local_708,beta,betaComp,nComp);
  amrex::MLMG::MLMG(&local_8a0,(MLLinOp *)local_708);
  local_8a0.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
  local_8a0.verbose = verbose;
  amrex::MFIter::MFIter((MFIter *)&local_a28,&local_1b0.super_FabArrayBase,true);
  if ((int)local_a28._32_4_ < (int)local_a28._40_4_) {
    local_b50._M_head_impl = (MultiFab *)(ulong)(uint)nComp;
    do {
      amrex::MFIter::tilebox(&local_b98,(MFIter *)&local_a28);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_b20,&local_1b0,(MFIter *)&local_a28);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_ab8,local_ad8,(MFIter *)&local_a28);
      if (0 < nComp) {
        local_b70 = CONCAT44(local_b70._4_4_,local_b98.smallend.vect[2]);
        lVar11 = (long)local_b98.smallend.vect[1];
        local_b40 = (lVar11 - local_ab8.begin.y) * local_ab8.jstride * 8 +
                    (long)local_b98.smallend.vect[0] * 8 + (long)local_ab8.begin.x * -8 +
                    (long)local_ab8.p;
        local_b30 = local_ab8.kstride * 8;
        local_b38 = -(long)local_ab8.begin.z;
        lVar10 = (lVar11 - local_b20.begin.y) * local_b20.jstride * 8 +
                 (long)local_b98.smallend.vect[0] * 8 + (long)local_b20.begin.x * -8 +
                 CONCAT71(local_b20.p._1_7_,local_b20.p._0_1_);
        local_b48 = local_b20.nstride * 8;
        local_ba8._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
             (local_b20.kstride * 8);
        local_bb0 = -(long)local_b20.begin.z;
        lVar15 = 0;
        do {
          local_b68 = lVar15;
          iVar6 = local_b98.smallend.vect[2];
          if (local_b98.smallend.vect[2] <= local_b98.bigend.vect[2]) {
            do {
              if (local_b98.smallend.vect[1] <= local_b98.bigend.vect[1]) {
                lVar16 = (local_b38 + iVar6) * local_b30 + local_b40;
                lVar12 = (iVar6 + local_bb0) *
                         (long)local_ba8._M_t.
                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                         lVar10;
                lVar15 = lVar11;
                do {
                  if (local_b98.smallend.vect[0] <= local_b98.bigend.vect[0]) {
                    lVar13 = 0;
                    do {
                      dVar19 = *(double *)(lVar12 + lVar13 * 8) * local_ac0;
                      *(double *)(lVar12 + lVar13 * 8) = dVar19;
                      if (rho_flag == 1) {
                        *(double *)(lVar12 + lVar13 * 8) = dVar19 * *(double *)(lVar16 + lVar13 * 8)
                        ;
                      }
                      lVar13 = lVar13 + 1;
                    } while ((local_b98.bigend.vect[0] - local_b98.smallend.vect[0]) + 1 !=
                             (int)lVar13);
                  }
                  lVar15 = lVar15 + 1;
                  lVar16 = lVar16 + local_ab8.jstride * 8;
                  lVar12 = lVar12 + local_b20.jstride * 8;
                } while (local_b98.bigend.vect[1] + 1 != (int)lVar15);
              }
              bVar17 = iVar6 != local_b98.bigend.vect[2];
              iVar6 = iVar6 + 1;
            } while (bVar17);
          }
          lVar10 = lVar10 + local_b48;
          lVar15 = local_b68 + 1U;
        } while ((MultiFab *)(local_b68 + 1U) != local_b50._M_head_impl);
      }
      amrex::MFIter::operator++((MFIter *)&local_a28);
    } while ((int)local_a28._32_4_ < (int)local_a28._40_4_);
  }
  amrex::MFIter::~MFIter((MFIter *)&local_a28);
  local_ab8.p = (double *)&local_330;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_ab8;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a28,__l_03,
             (allocator_type *)&local_b28);
  local_b98.smallend.vect._0_8_ = &local_1b0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_b98;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_b20
             ,__l_04,(allocator_type *)local_b9c);
  amrex::MLMG::solve(&local_8a0,
                     (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a28,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_b20,local_a58,-1.0,(char *)0x0);
  pvVar3 = (void *)CONCAT71(local_b20.p._1_7_,local_b20.p._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_b20.kstride - (long)pvVar3);
  }
  if ((FabArrayBase *)local_a28._0_8_ != (FabArrayBase *)0x0) {
    operator_delete((void *)local_a28._0_8_,local_a28._16_8_ - local_a28._0_8_);
  }
  checkBeta(flux,(int *)&local_b28,(int *)local_b9c);
  if ((int)local_b28 != 0) {
    computeExtensiveFluxes
              (&local_8a0,(MultiFab *)&local_330,flux,fluxComp,nComp,
               (MultiFab *)&this->navier_stokes->field_0x540,local_b78 / local_ae0);
  }
  amrex::MultiFab::Copy((MultiFab *)local_b60,(MultiFab *)&local_330,0,(int)local_b58,nComp,0);
  if (1 < verbose && 0 < nComp) {
    iVar6 = 0;
    puVar4 = (undefined8 *)&local_a28.ss;
    do {
      RVar18 = amrex::MultiFab::norm0
                         ((MultiFab *)&local_330,iVar6,local_330.super_FabArrayBase.n_grow.vect[0],
                          false,false);
      local_a28.os = amrex::OutStream();
      local_a28.comm = *(undefined4 *)(DAT_00816950 + -0x48);
      local_a28.rank = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar4);
      *(undefined8 *)(&local_a28.field_0x18 + *(long *)(local_a28._16_8_ + -0x18)) =
           *(undefined8 *)
            ((ostream *)((long)local_a28.os + 8) + *(long *)(*(long *)local_a28.os + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar4,"Final max of Ssync for comp ",0x1c);
      std::ostream::operator<<(puVar4,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,": ",2);
      std::ostream::_M_insert<double>(RVar18);
      local_b20.p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,(char *)&local_b20,1);
      amrex::Print::~Print(&local_a28);
      iVar6 = iVar6 + 1;
    } while (nComp != iVar6);
  }
  if (rho_flag == 2) {
    local_b50._M_head_impl =
         *(MultiFab **)
          &(((this->navier_stokes->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::MFIter::MFIter((MFIter *)&local_a28,(FabArrayBase *)local_b50._M_head_impl,true);
    if ((int)local_a28._32_4_ < (int)local_a28._40_4_) {
      local_b48 = (ulong)(uint)nComp;
      do {
        amrex::MFIter::tilebox(&local_b98,(MFIter *)&local_a28);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_b20,local_b60,(MFIter *)&local_a28,(int)local_b58);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_ab8,&(local_b50._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&local_a28,3);
        if (0 < nComp) {
          local_b68 = CONCAT44(local_b68._4_4_,local_b98.smallend.vect[2]);
          lVar10 = (long)local_b98.smallend.vect[1];
          lVar15 = (lVar10 - local_b20.begin.y) * local_b20.jstride * 8 +
                   (long)local_b98.smallend.vect[0] * 8 + (long)local_b20.begin.x * -8 +
                   CONCAT71(local_b20.p._1_7_,local_b20.p._0_1_);
          local_b70 = local_b20.nstride * 8;
          local_bb0 = local_b20.kstride * 8;
          local_b30 = -(long)local_b20.begin.z;
          local_b38 = (lVar10 - local_ab8.begin.y) * local_ab8.jstride * 8 +
                      (long)local_b98.smallend.vect[0] * 8 + (long)local_ab8.begin.x * -8 +
                      (long)local_ab8.p;
          local_ba8._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
               -(long)local_ab8.begin.z;
          uVar5 = 0;
          do {
            local_b40 = uVar5;
            iVar6 = local_b98.smallend.vect[2];
            if (local_b98.smallend.vect[2] <= local_b98.bigend.vect[2]) {
              do {
                if (local_b98.smallend.vect[1] <= local_b98.bigend.vect[1]) {
                  lVar16 = (local_b30 + iVar6) * local_bb0 + lVar15;
                  lVar12 = local_b38 +
                           ((long)&(((MultiFab *)
                                    local_ba8._M_t.
                                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                                   super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                   _vptr_FabArrayBase + (long)iVar6) * local_ab8.kstride * 8;
                  lVar11 = lVar10;
                  do {
                    if (local_b98.smallend.vect[0] <= local_b98.bigend.vect[0]) {
                      lVar13 = 0;
                      do {
                        *(double *)(lVar16 + lVar13 * 8) =
                             *(double *)(lVar12 + lVar13 * 8) * *(double *)(lVar16 + lVar13 * 8);
                        lVar13 = lVar13 + 1;
                      } while ((local_b98.bigend.vect[0] - local_b98.smallend.vect[0]) + 1 !=
                               (int)lVar13);
                    }
                    lVar11 = lVar11 + 1;
                    lVar16 = lVar16 + local_b20.jstride * 8;
                    lVar12 = lVar12 + local_ab8.jstride * 8;
                  } while (local_b98.bigend.vect[1] + 1 != (int)lVar11);
                }
                bVar17 = iVar6 != local_b98.bigend.vect[2];
                iVar6 = iVar6 + 1;
              } while (bVar17);
            }
            lVar15 = lVar15 + local_b70;
            uVar5 = local_b40 + 1;
          } while (local_b40 + 1 != local_b48);
        }
        amrex::MFIter::operator++((MFIter *)&local_a28);
      } while ((int)local_a28._32_4_ < (int)local_a28._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)&local_a28);
  }
  if (verbose != 0) {
    dVar19 = amrex::ParallelDescriptor::second();
    local_a28.os = amrex::OutStream();
    puVar4 = (undefined8 *)&local_a28.ss;
    local_a28.comm = *(undefined4 *)(DAT_00816950 + -0x48);
    local_a28.rank = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar4);
    *(undefined8 *)(&local_a28.field_0x18 + *(long *)(local_a28._16_8_ + -0x18)) =
         *(undefined8 *)
          ((ostream *)((long)local_a28.os + 8) + *(long *)(*(long *)local_a28.os + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar4,"Diffusion::diffuse_Ssync(): lev: ",0x21);
    std::ostream::operator<<(puVar4,this->level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,", time: ",8);
    std::ostream::_M_insert<double>(dVar19 - local_a60);
    local_b20.p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,(char *)&local_b20,1);
    amrex::Print::~Print(&local_a28);
  }
  amrex::MLMG::~MLMG(&local_8a0);
  amrex::MLEBABecLap::~MLEBABecLap((MLEBABecLap *)local_708);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_330);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
Diffusion::diffuse_Ssync (MultiFab&              Ssync,
                          int                    sigma,
                          int                    nComp,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          MultiFab* const*       flux,
                          int                    fluxComp,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          const MultiFab*        alpha,
                          int                    alphaComp)
{
    const int state_ind    = sigma + AMREX_SPACEDIM;
    if (verbose)
    {
       for (int comp = 0; comp < nComp; ++comp) {
          amrex::Print() << "Diffusion::diffuse_Ssync lev: " << level << " "
                         << navier_stokes->get_desc_lst()[State_Type].name(state_ind+comp) << '\n';
       }
    }

    const Real strt_time = ParallelDescriptor::second();

    int allthere;
    checkBeta(beta, allthere);

    MultiFab  Rhs(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Ssync,sigma,0,nComp,0);

    if (verbose > 1)
    {
        MultiFab junk(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());
        MultiFab::Copy(junk,Rhs,0,0,nComp,0);
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
        for (int comp = 0; comp < nComp; ++comp) {
            if (rho_flag == 2)
            {
                MultiFab::Divide(junk, S_new, Density, comp, 1, 0);
            }
            Real r_norm = junk.norm0(comp);
            amrex::Print() << "Original max of Ssync of comp " << comp << ": " << r_norm << '\n';
        }
    }
    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real  a = 1.0;
    Real        b = be_cn_theta*dt;
    Real rhsscale = 1.0;

    const Real S_tol     = visc_tol;
    const Real S_tol_abs = -1;

    MultiFab Soln(grids,dmap,nComp,1,MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf}, nComp);
#else
    MLABecLaplacian mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {}, nComp);
#endif
    mlabec.setMaxOrder(max_order);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    setDomainBC(mlmg_lobc, mlmg_hibc, state_ind);

    mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);
    if (level > 0) {
      mlabec.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    mlabec.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const Real cur_time = navier_stokes->get_state_data(State_Type).curTime();
      MultiFab& S = navier_stokes->get_data(State_Type,cur_time);
      const MultiFab& rho = (rho_flag == 1) ? rho_half : S;
      const int Rho_comp = (rho_flag ==1) ? 0 : Density;

      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, alpha, alphaComp,
                   rho_flag, &rho, Rho_comp);
      mlabec.setScalars(scalars.first, scalars.second);
      mlabec.setACoeffs(0, acoef);
    }

    setBeta(mlabec, beta, betaComp, nComp);

    MLMG mlmg(mlabec);
    if (use_hypre) {
      mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
      mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs_arr  = Rhs.array(mfi);
        auto const& rhoh_arr = rho_half.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [=]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            rhs_arr(i,j,k,n) *= rhsscale;
            if (rho_flag == 1) {
               rhs_arr(i,j,k,n) *= rhoh_arr(i,j,k);
            }
        });
    }

    mlmg.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    int flux_allthere, flux_allnull;
    checkBeta(flux, flux_allthere, flux_allnull);
    if (flux_allthere)
    {
        computeExtensiveFluxes(mlmg, Soln, flux, fluxComp, nComp,
			       navier_stokes->area, b/dt);
    }

    MultiFab::Copy(Ssync,Soln,0,sigma,nComp,0);

    if (verbose > 1)
    {
        for (int comp = 0; comp < nComp; ++comp) {
           Real s_norm = Soln.norm0(comp,Soln.nGrow());
           amrex::Print() << "Final max of Ssync for comp " << comp << ": " << s_norm << '\n';
        }
    }

    if (rho_flag == 2)
    {
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       for (MFIter mfi(S_new, TilingIfNotGPU()); mfi.isValid(); ++mfi)
       {
           const Box& bx = mfi.tilebox();
           auto const& ssync_arr = Ssync.array(mfi,sigma);
           auto const& rho_arr   = S_new.const_array(mfi,Density);
           amrex::ParallelFor(bx, nComp, [ssync_arr, rho_arr]
           AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
           {
               ssync_arr(i,j,k,n) *= rho_arr(i,j,k);
           });
       }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;
        ParallelDescriptor::ReduceRealMax(run_time,IOProc);
        amrex::Print() << "Diffusion::diffuse_Ssync(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}